

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveQueries.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderPrimitiveQueries::GeometryShaderPrimitiveQueries
          (GeometryShaderPrimitiveQueries *this,Context *context,ExtParameters *extParams,char *name
          ,char *description)

{
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCaseBase_02106508;
  this->m_n_texture_components = 4;
  this->m_bo_large_id = 0;
  this->m_bo_small_id = 0;
  this->m_fs_id = 0;
  this->m_gs_id = 0;
  this->m_po_id = 0;
  this->m_qo_primitives_generated_id = 0;
  this->m_qo_tf_primitives_written_id = 0;
  this->m_vao_id = 0;
  this->m_vs_id = 0;
  return;
}

Assistant:

GeometryShaderPrimitiveQueries::GeometryShaderPrimitiveQueries(Context& context, const ExtParameters& extParams,
															   const char* name, const char* description)
	: TestCaseBase(context, extParams, name, description)
	, m_n_texture_components(4)
	, m_bo_large_id(0)
	, m_bo_small_id(0)
	, m_fs_id(0)
	, m_gs_id(0)
	, m_po_id(0)
	, m_qo_primitives_generated_id(0)
	, m_qo_tf_primitives_written_id(0)
	, m_vao_id(0)
	, m_vs_id(0)
{
	/* Nothing to be done here */
}